

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-map.c
# Opt level: O0

void square_note_spot(chunk *c,loc grid)

{
  _Bool _Var1;
  chunk *c_local;
  loc grid_local;
  
  if ((c == (chunk *)cave) &&
     ((_Var1 = square_isseen(c,(loc_conflict)grid), _Var1 ||
      (_Var1 = square_isplayer(c,(loc_conflict)grid), _Var1)))) {
    square_know_pile(c,(loc_conflict)grid,(_func__Bool_object_ptr *)0x0);
    _Var1 = square_issecrettrap(c,(loc_conflict)grid);
    if (_Var1) {
      square_reveal_trap((chunk_conflict2 *)c,(loc_conflict)grid,false,true);
    }
    square_memorize_traps((chunk_conflict2 *)c,(loc_conflict)grid);
    _Var1 = square_ismemorybad(c,(loc_conflict)grid);
    if (_Var1) {
      square_memorize(c,(loc_conflict)grid);
    }
  }
  return;
}

Assistant:

void square_note_spot(struct chunk *c, struct loc grid)
{
	/* Require "seen" flag and the current level */
	if (c != cave) return;
	if (!square_isseen(c, grid) && !square_isplayer(c, grid)) return;

	/* Make the player know precisely what is on this grid */
	square_know_pile(c, grid, NULL);

	/* Notice traps, memorize those we can see */
	if (square_issecrettrap(c, grid)) {
		square_reveal_trap(c, grid, false, true);
	}
	square_memorize_traps(c, grid);

	if (!square_ismemorybad(c, grid))
		return;

	/* Memorize this grid */
	square_memorize(c, grid);
}